

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_connect(Curl_easy *data,connectdata *conn,int sockindex)

{
  undefined4 in_EAX;
  CURLcode CVar1;
  undefined4 in_register_00000004;
  _Bool done;
  undefined8 uStack_8;
  
  uStack_8 = CONCAT44(in_register_00000004,in_EAX) & 0xffffffffffffff;
  CVar1 = ossl_connect_common(data,conn,sockindex,false,(_Bool *)((long)&uStack_8 + 7));
  return CVar1;
}

Assistant:

static CURLcode ossl_connect(struct Curl_easy *data, struct connectdata *conn,
                             int sockindex)
{
  CURLcode result;
  bool done = FALSE;

  result = ossl_connect_common(data, conn, sockindex, FALSE, &done);
  if(result)
    return result;

  DEBUGASSERT(done);

  return CURLE_OK;
}